

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PInt::WriteValue(PInt *this,FArchive *ar,void *addr)

{
  int iVar1;
  bool bVar2;
  undefined8 in_RAX;
  BYTE BVar3;
  byte bVar4;
  ulong val;
  BYTE out [2];
  undefined8 uStack_28;
  
  iVar1 = *(int *)&this->field_0x24;
  uStack_28 = in_RAX;
  if (iVar1 == 1) {
    bVar4 = *addr;
    goto LAB_0049d4eb;
  }
  if (this->Unsigned == true) {
    if (iVar1 == 4) {
      val = (ulong)*addr;
LAB_0049d46b:
      if ((uint)val < 0x10000) {
LAB_0049d4a8:
        if ((uint)val < 0x100) goto LAB_0049d4e5;
        BVar3 = '\x03';
        goto LAB_0049d4d0;
      }
      BVar3 = '\x05';
LAB_0049d492:
      FArchive::WriteByte(ar,BVar3);
      FArchive::WriteInt32(ar,(DWORD)val);
    }
    else {
      if (iVar1 != 8) {
        val = (ulong)*addr;
        goto LAB_0049d4a8;
      }
      val = *addr;
      if (val >> 0x20 == 0) goto LAB_0049d46b;
      FArchive::WriteByte(ar,'\a');
      FArchive::WriteInt64(ar,val);
    }
LAB_0049d4e1:
    bVar4 = (byte)val;
    bVar2 = false;
  }
  else {
    if (iVar1 == 4) {
      val = (ulong)*addr;
LAB_0049d481:
      if ((int)(short)val != (int)val) {
        BVar3 = '\x04';
        goto LAB_0049d492;
      }
    }
    else {
      if (iVar1 == 8) {
        val = *addr;
        if ((long)(int)val != val) {
          FArchive::WriteByte(ar,'\x06');
          FArchive::WriteInt64(ar,val);
        }
        if (val + 0x80000000 >> 0x20 != 0) goto LAB_0049d4e1;
        goto LAB_0049d481;
      }
      val = (ulong)(uint)(int)*addr;
    }
    if ((int)(char)val != (int)val) {
      BVar3 = '\x02';
LAB_0049d4d0:
      FArchive::WriteByte(ar,BVar3);
      FArchive::WriteInt16(ar,(WORD)val);
      goto LAB_0049d4e1;
    }
LAB_0049d4e5:
    bVar4 = (byte)val;
    bVar2 = true;
  }
  if (!bVar2) {
    return;
  }
LAB_0049d4eb:
  if (1 < bVar4) {
    uStack_28 = CONCAT17(bVar4,CONCAT16(this->Unsigned,(undefined6)uStack_28));
    (*ar->_vptr_FArchive[2])(ar,(long)&uStack_28 + 6,2);
    return;
  }
  FArchive::WriteByte(ar,bVar4 | 8);
  return;
}

Assistant:

void PInt::WriteValue(FArchive &ar, const void *addr) const
{
	BYTE bval;

	// The process for bytes is the same whether signed or unsigned, since
	// they can't be compacted into a representation with fewer bytes.
	if (Size == 1)
	{
		bval = *(BYTE *)addr;
	}
	else if (Unsigned)
	{
		unsigned val;
		if (Size == 8)
		{
			QWORD qval = *(QWORD *)addr;
			if (qval & 0xFFFFFFFF00000000llu)
			{ // Value needs 64 bits
				ar.WriteByte(VAL_UInt64);
				ar.WriteInt64(qval);
				return;
			}
			// Value can fit in 32 bits or less
			val = (unsigned)qval;
			goto check_u32;
		}
		else if (Size == 4)
		{
			val = *(DWORD *)addr;
check_u32:	if (val & 0xFFFF0000u)
			{ // Value needs 32 bits
				ar.WriteByte(VAL_UInt32);
				ar.WriteInt32(val);
				return;
			}
			// Value can fit in 16 bits or less
			goto check_u16;
		}
		else// if (Size == 2)
		{
			val = *(WORD *)addr;
check_u16:	if (val & 0xFFFFFF00u)
			{ // Value needs 16 bits
				ar.WriteByte(VAL_UInt16);
				ar.WriteInt16(val);
				return;
			}
			// Value can fit in 8 bits
			bval = (BYTE)val;
		}
	}
	else // Signed
	{
		int val;
		if (Size == 8)
		{
			SQWORD qval = *(SQWORD *)addr;
			INT_MIN;
			if (qval < (-0x7FFFFFFF - 1) || qval > 0x7FFFFFFF)
			{ // Value needs 64 bits
				ar.WriteByte(VAL_Int64);
				ar.WriteInt64(qval);
				return;
			}
			// Value can fit in 32 bits or less
			val = (int)qval;
			goto check_s32;
		}
		else if (Size == 4)
		{
			val = *(SDWORD *)addr;
check_s32:	if (val < -0x8000 || val > 0x7FFF)
			{ // Value needs 32 bits
				ar.WriteByte(VAL_Int32);
				ar.WriteInt32(val);
				return;
			}
			// Value can fit in 16 bits or less
			goto check_s16;
		}
		else// if (Size == 2)
		{
			val = *(SWORD *)addr;
check_s16:	if (val < -0x80 || val > 0x7F)
			{ // Value needs 16 bits
				ar.WriteByte(VAL_Int16);
				ar.WriteInt16(val);
				return;
			}
			// Value can fit in 8 bits
			bval = (BYTE)val;
		}
	}
	// If we get here, the value fits in a byte. Values of 0 and 1 are
	// optimized away into the tag so they don't require any extra space
	// to store.
	if (bval & 0xFE)
	{
		BYTE out[2] = { Unsigned ? VAL_UInt8 : VAL_Int8, bval };
		ar.Write(out, 2);
	}
	else
	{
		ar.WriteByte(VAL_Zero + bval);
	}
}